

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

ImGuiTableColumnFlags ImGui::TableGetColumnFlags(int column_n)

{
  ImGuiTable *pIVar1;
  ImGuiTableColumn *pIVar2;
  ImGuiTable *table;
  ImGuiContext *g;
  int column_n_local;
  
  pIVar1 = GImGui->CurrentTable;
  if (pIVar1 == (ImGuiTable *)0x0) {
    g._4_4_ = 0;
  }
  else {
    g._0_4_ = column_n;
    if (column_n < 0) {
      g._0_4_ = pIVar1->CurrentColumn;
    }
    if ((int)g == pIVar1->ColumnsCount) {
      g._4_4_ = 0;
      if (pIVar1->HoveredColumnBody == (int)g) {
        g._4_4_ = 0x8000000;
      }
    }
    else {
      pIVar2 = ImSpan<ImGuiTableColumn>::operator[](&pIVar1->Columns,(int)g);
      g._4_4_ = pIVar2->Flags;
    }
  }
  return g._4_4_;
}

Assistant:

ImGuiTableColumnFlags ImGui::TableGetColumnFlags(int column_n)
{
    ImGuiContext& g = *GImGui;
    ImGuiTable* table = g.CurrentTable;
    if (!table)
        return ImGuiTableColumnFlags_None;
    if (column_n < 0)
        column_n = table->CurrentColumn;
    if (column_n == table->ColumnsCount)
        return (table->HoveredColumnBody == column_n) ? ImGuiTableColumnFlags_IsHovered : ImGuiTableColumnFlags_None;
    return table->Columns[column_n].Flags;
}